

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::StreamingListener::~StreamingListener(StreamingListener *this)

{
  ~StreamingListener(this);
  operator_delete(this,0x50);
  return;
}

Assistant:

virtual ~StreamingListener() {
    if (sockfd_ != -1)
      CloseConnection();
  }